

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCheck.h
# Opt level: O1

string * __thiscall
cppqc::CompactCheck<C_A_T_C_H_T_E_S_T_0()::$_0,void,void,bool>::classify_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool *v)

{
  undefined8 local_f;
  undefined4 local_7;
  undefined2 local_3;
  char local_1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 1) = local_f;
  *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = local_7;
  *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = local_3;
  (__return_storage_ptr__->field_2)._M_local_buf[0xf] = local_1;
  __return_storage_ptr__->_M_string_length = 0;
  return __return_storage_ptr__;
}

Assistant:

std::string classify(const T&... v) const override {
    return m_classifyFnc.apply(std::string(), v...);
  }